

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,false,false>
               (string_t *ldata,interval_t *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  interval_t iVar11;
  interval_t date;
  interval_t date_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar5 = 8;
    while (bVar10 = count != 0, count = count - 1, bVar10) {
      specifier_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + lVar5);
      specifier_01.value._0_8_ = *(undefined8 *)((long)ldata + lVar5 + -8);
      iVar11.micros = *(int64_t *)((long)&rdata->months + lVar5);
      iVar11._0_8_ = *(undefined8 *)((long)rdata + lVar5 + -8);
      iVar11 = DateTruncBinaryOperator::
               Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
                         (specifier_01,iVar11);
      *(long *)((long)result_data + lVar5 + -8) = iVar11._0_8_;
      *(int64_t *)((long)&result_data->months + lVar5) = iVar11.micros;
      lVar5 = lVar5 + 0x10;
    }
  }
  else {
    uVar4 = 0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar7 = count;
        }
LAB_01dd2fc6:
        uVar8 = uVar4 << 4 | 8;
        for (; uVar2 = uVar4, uVar4 < uVar7; uVar4 = uVar4 + 1) {
          specifier.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar8);
          specifier.value._0_8_ = *(undefined8 *)((long)ldata + (uVar8 - 8));
          date.micros = *(int64_t *)((long)&rdata->months + uVar8);
          date._0_8_ = *(undefined8 *)((long)rdata + (uVar8 - 8));
          iVar11 = DateTruncBinaryOperator::
                   Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>(specifier,date)
          ;
          *(long *)((long)result_data + (uVar8 - 8)) = iVar11._0_8_;
          *(int64_t *)((long)&result_data->months + uVar8) = iVar11.micros;
          uVar8 = uVar8 + 0x10;
        }
      }
      else {
        uVar8 = puVar1[uVar3];
        uVar7 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar7 = count;
        }
        if (uVar8 == 0xffffffffffffffff) goto LAB_01dd2fc6;
        uVar2 = uVar7;
        if (uVar8 != 0) {
          uVar6 = uVar4 << 4 | 8;
          for (uVar9 = 0; uVar2 = uVar4 + uVar9, uVar4 + uVar9 < uVar7; uVar9 = uVar9 + 1) {
            if ((uVar8 >> (uVar9 & 0x3f) & 1) != 0) {
              specifier_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar6);
              specifier_00.value._0_8_ = *(undefined8 *)((long)ldata + (uVar6 - 8));
              date_00.micros = *(int64_t *)((long)&rdata->months + uVar6);
              date_00._0_8_ = *(undefined8 *)((long)rdata + (uVar6 - 8));
              iVar11 = DateTruncBinaryOperator::
                       Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
                                 (specifier_00,date_00);
              *(long *)((long)result_data + (uVar6 - 8)) = iVar11._0_8_;
              *(int64_t *)((long)&result_data->months + uVar6) = iVar11.micros;
            }
            uVar6 = uVar6 + 0x10;
          }
        }
      }
      uVar4 = uVar2;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}